

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

TextureFormat glu::mapGLTransferFormat(deUint32 format,deUint32 dataType)

{
  ChannelType CVar1;
  InternalError *this;
  deUint64 local_120;
  string local_118;
  deUint64 local_f8;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  deUint32 local_18;
  deUint32 local_14;
  deUint32 dataType_local;
  deUint32 format_local;
  
  local_18 = dataType;
  local_14 = format;
  if (format == 0x1902) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,D,CVar1);
  }
  else if (format == 0x1903) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,R,CVar1);
  }
  else if (format == 0x1906) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,A,CVar1);
  }
  else if (format == 0x1907) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,RGB,CVar1);
  }
  else if (format == 0x1908) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,RGBA,CVar1);
  }
  else if (format == 0x1909) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,L,CVar1);
  }
  else if (format == 0x190a) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,LA,CVar1);
  }
  else if (format == 0x80e1) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,BGRA,CVar1);
  }
  else if (format == 0x8227) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,RG,CVar1);
  }
  else if (format == 0x8228) {
    CVar1 = mapGLChannelType(dataType,false);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,RG,CVar1);
  }
  else if (format == 0x84f9) {
    CVar1 = mapGLChannelType(dataType,true);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,DS,CVar1);
  }
  else if (format == 0x8d94) {
    CVar1 = mapGLChannelType(dataType,false);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,R,CVar1);
  }
  else if (format == 0x8d98) {
    CVar1 = mapGLChannelType(dataType,false);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,RGB,CVar1);
  }
  else {
    if (format != 0x8d99) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Can\'t map GL pixel format (",&local_b9);
      local_f8 = (deUint64)tcu::toHex<unsigned_int>(local_14);
      tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_f0,&local_f8);
      std::operator+(&local_98,&local_b8,&local_f0);
      std::operator+(&local_78,&local_98,", ");
      local_120 = (deUint64)tcu::toHex<unsigned_int>(local_18);
      tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_118,&local_120);
      std::operator+(&local_58,&local_78,&local_118);
      std::operator+(&local_38,&local_58,") to texture format");
      tcu::InternalError::InternalError(this,&local_38);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    CVar1 = mapGLChannelType(dataType,false);
    tcu::TextureFormat::TextureFormat((TextureFormat *)&dataType_local,RGBA,CVar1);
  }
  return _dataType_local;
}

Assistant:

tcu::TextureFormat mapGLTransferFormat (deUint32 format, deUint32 dataType)
{
	using tcu::TextureFormat;
	switch (format)
	{
		case GL_ALPHA:				return TextureFormat(TextureFormat::A,		mapGLChannelType(dataType, true));
		case GL_LUMINANCE:			return TextureFormat(TextureFormat::L,		mapGLChannelType(dataType, true));
		case GL_LUMINANCE_ALPHA:	return TextureFormat(TextureFormat::LA,		mapGLChannelType(dataType, true));
		case GL_RGB:				return TextureFormat(TextureFormat::RGB,	mapGLChannelType(dataType, true));
		case GL_RGBA:				return TextureFormat(TextureFormat::RGBA,	mapGLChannelType(dataType, true));
		case GL_BGRA:				return TextureFormat(TextureFormat::BGRA,	mapGLChannelType(dataType, true));
		case GL_RG:					return TextureFormat(TextureFormat::RG,		mapGLChannelType(dataType, true));
		case GL_RED:				return TextureFormat(TextureFormat::R,		mapGLChannelType(dataType, true));
		case GL_RGBA_INTEGER:		return TextureFormat(TextureFormat::RGBA,	mapGLChannelType(dataType, false));
		case GL_RGB_INTEGER:		return TextureFormat(TextureFormat::RGB,	mapGLChannelType(dataType, false));
		case GL_RG_INTEGER:			return TextureFormat(TextureFormat::RG,		mapGLChannelType(dataType, false));
		case GL_RED_INTEGER:		return TextureFormat(TextureFormat::R,		mapGLChannelType(dataType, false));

		case GL_DEPTH_COMPONENT:	return TextureFormat(TextureFormat::D,		mapGLChannelType(dataType, true));
		case GL_DEPTH_STENCIL:		return TextureFormat(TextureFormat::DS,		mapGLChannelType(dataType, true));

		default:
			throw tcu::InternalError(string("Can't map GL pixel format (") + tcu::toHex(format).toString() + ", " + tcu::toHex(dataType).toString() + ") to texture format");
	}
}